

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_management.c
# Opt level: O1

int amqp_management_close(AMQP_MANAGEMENT_HANDLE amqp_management)

{
  AMQP_MANAGEMENT_STATE AVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  LIST_ITEM_HANDLE item_handle;
  undefined8 *puVar4;
  int iVar5;
  char *pcVar6;
  
  if (amqp_management == (AMQP_MANAGEMENT_HANDLE)0x0) {
    p_Var3 = xlogging_get_log_function();
    iVar2 = 0x417;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return 0x417;
    }
    pcVar6 = "NULL amqp_management";
    iVar5 = 0x416;
  }
  else {
    AVar1 = amqp_management->amqp_management_state;
    if (AVar1 == AMQP_MANAGEMENT_STATE_IDLE) {
      p_Var3 = xlogging_get_log_function();
      iVar2 = 0x41d;
      if (p_Var3 == (LOGGER_LOG)0x0) {
        return 0x41d;
      }
      pcVar6 = "AMQP management instance not open";
      iVar5 = 0x41c;
    }
    else {
      amqp_management->amqp_management_state = AMQP_MANAGEMENT_STATE_CLOSING;
      if (AVar1 == AMQP_MANAGEMENT_STATE_OPENING) {
        (*amqp_management->on_amqp_management_open_complete)
                  (amqp_management->on_amqp_management_open_complete_context,
                   AMQP_MANAGEMENT_OPEN_CANCELLED);
      }
      iVar2 = messagesender_close(amqp_management->message_sender);
      if (iVar2 == 0) {
        iVar2 = messagereceiver_close(amqp_management->message_receiver);
        if (iVar2 == 0) {
          item_handle = singlylinkedlist_get_head_item(amqp_management->pending_operations);
          while (item_handle != (LIST_ITEM_HANDLE)0x0) {
            puVar4 = (undefined8 *)singlylinkedlist_item_get_value(item_handle);
            if (puVar4 == (undefined8 *)0x0) {
              p_Var3 = xlogging_get_log_function();
              if (p_Var3 != (LOGGER_LOG)0x0) {
                (*p_Var3)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                          ,"amqp_management_close",0x443,1,"Cannot obtain pending operation");
              }
            }
            else {
              if ((code *)*puVar4 != (code *)0x0) {
                (*(code *)*puVar4)(puVar4[1],4,0,0,0);
              }
              async_operation_destroy((ASYNC_OPERATION_HANDLE)puVar4[6]);
            }
            iVar2 = singlylinkedlist_remove(amqp_management->pending_operations,item_handle);
            if ((iVar2 != 0) && (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
                        ,"amqp_management_close",0x452,1,"Cannot remove item");
            }
            item_handle = singlylinkedlist_get_head_item(amqp_management->pending_operations);
          }
          amqp_management->amqp_management_state = AMQP_MANAGEMENT_STATE_IDLE;
          return 0;
        }
        p_Var3 = xlogging_get_log_function();
        iVar2 = 0x439;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return 0x439;
        }
        pcVar6 = "messagereceiver_close failed";
        iVar5 = 0x438;
      }
      else {
        p_Var3 = xlogging_get_log_function();
        iVar2 = 0x432;
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return 0x432;
        }
        pcVar6 = "messagesender_close failed";
        iVar5 = 0x431;
      }
    }
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqp_management.c"
            ,"amqp_management_close",iVar5,1,pcVar6);
  return iVar2;
}

Assistant:

int amqp_management_close(AMQP_MANAGEMENT_HANDLE amqp_management)
{
    int result;

    if (amqp_management == NULL)
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_047: [ If `amqp_management` is NULL, `amqp_management_close` shall fail and return a non-zero value. ]*/
        LogError("NULL amqp_management");
        result = MU_FAILURE;
    }
    else if (amqp_management->amqp_management_state == AMQP_MANAGEMENT_STATE_IDLE)
    {
        /* Codes_SRS_AMQP_MANAGEMENT_01_049: [ `amqp_management_close` on an AMQP management instance that is not OPEN, shall fail and return a non-zero value. ]*/
        LogError("AMQP management instance not open");
        result = MU_FAILURE;
    }
    else
    {
        AMQP_MANAGEMENT_STATE previous_state = amqp_management->amqp_management_state;

        amqp_management->amqp_management_state = AMQP_MANAGEMENT_STATE_CLOSING;

        if (previous_state == AMQP_MANAGEMENT_STATE_OPENING)
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_048: [ `amqp_management_close` on an AMQP management instance that is OPENING shall trigger the `on_amqp_management_open_complete` callback with `AMQP_MANAGEMENT_OPEN_CANCELLED`, while also passing the context passed in `amqp_management_open_async`. ]*/
            amqp_management->on_amqp_management_open_complete(amqp_management->on_amqp_management_open_complete_context, AMQP_MANAGEMENT_OPEN_CANCELLED);
        }


        /* Codes_SRS_AMQP_MANAGEMENT_01_045: [ `amqp_management_close` shall close the AMQP management instance. ]*/
        /* Codes_SRS_AMQP_MANAGEMENT_01_050: [ `amqp_management_close` shall close the message sender by calling `messagesender_close`. ]*/
        if (messagesender_close(amqp_management->message_sender) != 0)
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_052: [ If `messagesender_close` fails, `amqp_management_close` shall fail and return a non-zero value. ]*/
            LogError("messagesender_close failed");
            result = MU_FAILURE;
        }
        /* Codes_SRS_AMQP_MANAGEMENT_01_051: [ `amqp_management_close` shall close the message receiver by calling `messagereceiver_close`. ]*/
        else if (messagereceiver_close(amqp_management->message_receiver) != 0)
        {
            /* Codes_SRS_AMQP_MANAGEMENT_01_053: [ If `messagereceiver_close` fails, `amqp_management_close` shall fail and return a non-zero value. ]*/
            LogError("messagereceiver_close failed");
            result = MU_FAILURE;
        }
        else
        {
            LIST_ITEM_HANDLE list_item_handle = singlylinkedlist_get_head_item(amqp_management->pending_operations);
            while (list_item_handle != NULL)
            {
                OPERATION_MESSAGE_INSTANCE* operation_message = (OPERATION_MESSAGE_INSTANCE*)singlylinkedlist_item_get_value(list_item_handle);
                if (operation_message == NULL)
                {
                    LogError("Cannot obtain pending operation");
                }
                else
                {
                    /* Codes_SRS_AMQP_MANAGEMENT_01_054: [ All pending operations shall be indicated complete with the code `AMQP_MANAGEMENT_EXECUTE_OPERATION_INSTANCE_CLOSED`. ]*/
                    if (operation_message->on_execute_operation_complete != NULL)
                    {
                        // Check for NULL in case operation has been cancelled.
                        operation_message->on_execute_operation_complete(operation_message->callback_context, AMQP_MANAGEMENT_EXECUTE_OPERATION_INSTANCE_CLOSED, 0, NULL, NULL);
                    }
                    async_operation_destroy(operation_message->execute_async_operation);
                }

                if (singlylinkedlist_remove(amqp_management->pending_operations, list_item_handle) != 0)
                {
                    LogError("Cannot remove item");
                }

                list_item_handle = singlylinkedlist_get_head_item(amqp_management->pending_operations);
            }

            amqp_management->amqp_management_state = AMQP_MANAGEMENT_STATE_IDLE;

            /* Codes_SRS_AMQP_MANAGEMENT_01_046: [ On success it shall return 0. ]*/
            result = 0;
        }
    }

    return result;
}